

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O2

string * __thiscall
cppqc::CompactCheck<C_A_T_C_H_T_E_S_T_2()::$_0,void,void,bool>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator local_9;
  
  if (*(long *)((long)this + 0x18) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"no-name",&local_9);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return m_name.empty() ? "no-name" : m_name;
  }